

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O2

void __thiscall
SAX2SortAttributesFilter::startElement
          (SAX2SortAttributesFilter *this,XMLCh *uri,XMLCh *localname,XMLCh *qname,
          Attributes *attributes)

{
  RefVectorOf<Attr> *this_00;
  wchar16 *pwVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Attr *pAVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLSize_t j;
  ulong getAt;
  XMLSize_t i;
  ulong uVar4;
  AttrList sortedList;
  
  iVar2 = (*attributes->_vptr_Attributes[2])(attributes);
  AttrList::AttrList(&sortedList,CONCAT44(extraout_var,iVar2));
  this_00 = &sortedList.super_RefVectorOf<Attr>;
  uVar4 = 0;
  do {
    iVar2 = (*attributes->_vptr_Attributes[2])(attributes);
    if (CONCAT44(extraout_var_00,iVar2) <= uVar4) {
      xercesc_4_0::SAX2XMLFilterImpl::startElement
                ((wchar16 *)this,uri,localname,(Attributes *)qname);
      xercesc_4_0::RefVectorOf<Attr>::~RefVectorOf(this_00);
      return;
    }
    for (getAt = 0; getAt < sortedList.super_RefVectorOf<Attr>.super_BaseRefVectorOf<Attr>.fCurCount
        ; getAt = getAt + 1) {
      pAVar3 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt
                         (&this_00->super_BaseRefVectorOf<Attr>,getAt);
      pwVar1 = pAVar3->qName;
      iVar2 = (*attributes->_vptr_Attributes[5])(attributes,uVar4);
      iVar2 = xercesc_4_0::XMLString::compareString
                        (pwVar1,(wchar16 *)CONCAT44(extraout_var_01,iVar2));
      if (-1 < iVar2) break;
    }
    pAVar3 = (Attr *)operator_new(0x28);
    iVar2 = (*attributes->_vptr_Attributes[5])(attributes,uVar4);
    pAVar3->qName = (XMLCh *)CONCAT44(extraout_var_02,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[3])(attributes,uVar4);
    pAVar3->uri = (XMLCh *)CONCAT44(extraout_var_03,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[4])(attributes,uVar4);
    pAVar3->localPart = (XMLCh *)CONCAT44(extraout_var_04,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[7])(attributes,uVar4);
    pAVar3->value = (XMLCh *)CONCAT44(extraout_var_05,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[6])(attributes,uVar4);
    pAVar3->attrType = (XMLCh *)CONCAT44(extraout_var_06,iVar2);
    xercesc_4_0::BaseRefVectorOf<Attr>::insertElementAt
              (&this_00->super_BaseRefVectorOf<Attr>,pAVar3,getAt);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void SAX2SortAttributesFilter::startElement(const   XMLCh* const    uri,
                                            const   XMLCh* const    localname,
                                            const   XMLCh* const    qname,
                                            const   Attributes&		attributes)
{
    AttrList sortedList(attributes.getLength());
    for(XMLSize_t i=0;i<attributes.getLength();i++)
    {
        XMLSize_t j;
        for(j=0;j<sortedList.getLength();j++)
        {
            if(XMLString::compareString(sortedList.elementAt(j)->qName,attributes.getQName(i))>=0)
                break;
        }
        Attr* pClone=new Attr;
        pClone->qName       = attributes.getQName(i);
        pClone->uri         = attributes.getURI(i);
        pClone->localPart   = attributes.getLocalName(i);
        pClone->value       = attributes.getValue(i);
        pClone->attrType    = attributes.getType(i);
        sortedList.insertElementAt(pClone, j);
    }
    SAX2XMLFilterImpl::startElement(uri, localname, qname, sortedList);
}